

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void golf_alloc_get_debug_info(size_t *total_size)

{
  _golf_alloc_info_t *local_18;
  _golf_alloc_info_t *info;
  size_t *total_size_local;
  
  golf_mutex_lock(&_alloc_lock);
  *total_size = 0;
  local_18 = head;
  while (local_18->next != head) {
    local_18 = local_18->next;
    *total_size = local_18->size + *total_size;
  }
  golf_mutex_unlock(&_alloc_lock);
  return;
}

Assistant:

void golf_alloc_get_debug_info(size_t *total_size) {
    golf_mutex_lock(&_alloc_lock);
    *total_size = 0;
    _golf_alloc_info_t *info = head;
    while (info->next != head) {
        info = info->next;
        *total_size += info->size;
    }
    golf_mutex_unlock(&_alloc_lock);
}